

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode multi_socket(Curl_multi *multi,_Bool checkall,curl_socket_t s,int ev_bitmask,
                      int *running_handles)

{
  connectdata *pcVar1;
  CURLMcode CVar2;
  time_t tVar3;
  Curl_sh_entry *pCVar4;
  Curl_tree *pCVar5;
  curl_llist_element *pcVar6;
  int iVar7;
  undefined7 in_register_00000031;
  Curl_easy *pCVar8;
  curltime i;
  curltime now;
  curltime now_00;
  curltime cVar9;
  Curl_tree *t;
  int *local_d8;
  sigpipe_ignore pipe_st;
  
  cVar9 = Curl_now();
  tVar3 = cVar9.tv_sec;
  if ((int)CONCAT71(in_register_00000031,checkall) != 0) {
    CVar2 = curl_multi_perform(multi,running_handles);
    if (CVar2 == CURLM_BAD_HANDLE) {
      return CURLM_BAD_HANDLE;
    }
    pCVar8 = (Curl_easy *)&multi->easyp;
    while (pCVar8 = pCVar8->next, pCVar8 != (Curl_easy *)0x0) {
      singlesocket(multi,pCVar8);
    }
    return CVar2;
  }
  iVar7 = cVar9.tv_usec;
  local_d8 = running_handles;
  if (s == -1) {
    (multi->timer_lastcall).tv_sec = 0;
    *(undefined8 *)&(multi->timer_lastcall).tv_usec = 0;
  }
  else {
    pCVar4 = sh_getentry(&multi->sockhash,s);
    if (pCVar4 != (Curl_sh_entry *)0x0) {
      pCVar8 = pCVar4->easy;
      if (pCVar8->magic != 0xc0dedbad) {
        return CURLM_INTERNAL_ERROR;
      }
      pcVar1 = pCVar8->easy_conn;
      if ((pcVar1 != (connectdata *)0x0) &&
         ((((ev_bitmask & 2U) != 0 &&
           (pcVar6 = (pcVar1->send_pipe).head, pcVar6 != (curl_llist_element *)0x0)) ||
          (((ev_bitmask & 1U) != 0 &&
           (pcVar6 = (pcVar1->recv_pipe).head, pcVar6 != (curl_llist_element *)0x0)))))) {
        pCVar8 = (Curl_easy *)pcVar6->ptr;
      }
      pcVar1 = pCVar8->easy_conn;
      if ((pcVar1 != (connectdata *)0x0) && ((pcVar1->handler->flags & 8) == 0)) {
        pcVar1->cselect_bits = ev_bitmask;
      }
      sigpipe_ignore(pCVar8,&pipe_st);
      now_00._12_4_ = 0;
      now_00.tv_sec = SUB128(cVar9._0_12_,0);
      now_00.tv_usec = SUB124(cVar9._0_12_,8);
      CVar2 = multi_runsingle(multi,now_00,pCVar8);
      sigpipe_restore(&pipe_st);
      pcVar1 = pCVar8->easy_conn;
      if ((pcVar1 != (connectdata *)0x0) && ((pcVar1->handler->flags & 8) == 0)) {
        pcVar1->cselect_bits = 0;
      }
      if (CVar2 < CURLM_BAD_HANDLE) {
        singlesocket(multi,pCVar8);
      }
      cVar9 = Curl_now();
      tVar3 = cVar9.tv_sec;
      iVar7 = cVar9.tv_usec;
      goto LAB_0012a754;
    }
  }
  CVar2 = CURLM_OK;
LAB_0012a754:
  pCVar8 = (Curl_easy *)0x0;
  do {
    if (pCVar8 != (Curl_easy *)0x0) {
      sigpipe_ignore(pCVar8,&pipe_st);
      cVar9.tv_usec = iVar7;
      cVar9.tv_sec = tVar3;
      cVar9._12_4_ = 0;
      CVar2 = multi_runsingle(multi,cVar9,pCVar8);
      sigpipe_restore(&pipe_st);
      if (CVar2 < CURLM_BAD_HANDLE) {
        singlesocket(multi,pCVar8);
      }
    }
    i.tv_usec = iVar7;
    i.tv_sec = tVar3;
    i._12_4_ = 0;
    pCVar5 = Curl_splaygetbest(i,multi->timetree,&t);
    multi->timetree = pCVar5;
    if (t == (Curl_tree *)0x0) break;
    pCVar8 = (Curl_easy *)t->payload;
    now.tv_usec = iVar7;
    now.tv_sec = tVar3;
    now._12_4_ = 0;
    add_next_timeout(now,multi,pCVar8);
  } while (t != (Curl_tree *)0x0);
  *local_d8 = multi->num_alive;
  return CVar2;
}

Assistant:

static CURLMcode multi_socket(struct Curl_multi *multi,
                              bool checkall,
                              curl_socket_t s,
                              int ev_bitmask,
                              int *running_handles)
{
  CURLMcode result = CURLM_OK;
  struct Curl_easy *data = NULL;
  struct Curl_tree *t;
  struct curltime now = Curl_now();

  if(checkall) {
    /* *perform() deals with running_handles on its own */
    result = curl_multi_perform(multi, running_handles);

    /* walk through each easy handle and do the socket state change magic
       and callbacks */
    if(result != CURLM_BAD_HANDLE) {
      data = multi->easyp;
      while(data) {
        singlesocket(multi, data);
        data = data->next;
      }
    }

    /* or should we fall-through and do the timer-based stuff? */
    return result;
  }
  if(s != CURL_SOCKET_TIMEOUT) {

    struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

    if(!entry)
      /* Unmatched socket, we can't act on it but we ignore this fact.  In
         real-world tests it has been proved that libevent can in fact give
         the application actions even though the socket was just previously
         asked to get removed, so thus we better survive stray socket actions
         and just move on. */
      ;
    else {
      SIGPIPE_VARIABLE(pipe_st);

      data = entry->easy;

      if(data->magic != CURLEASY_MAGIC_NUMBER)
        /* bad bad bad bad bad bad bad */
        return CURLM_INTERNAL_ERROR;

      /* If the pipeline is enabled, take the handle which is in the head of
         the pipeline. If we should write into the socket, take the send_pipe
         head.  If we should read from the socket, take the recv_pipe head. */
      if(data->easy_conn) {
        if((ev_bitmask & CURL_POLL_OUT) &&
           data->easy_conn->send_pipe.head)
          data = data->easy_conn->send_pipe.head->ptr;
        else if((ev_bitmask & CURL_POLL_IN) &&
                data->easy_conn->recv_pipe.head)
          data = data->easy_conn->recv_pipe.head->ptr;
      }

      if(data->easy_conn &&
         !(data->easy_conn->handler->flags & PROTOPT_DIRLOCK))
        /* set socket event bitmask if they're not locked */
        data->easy_conn->cselect_bits = ev_bitmask;

      sigpipe_ignore(data, &pipe_st);
      result = multi_runsingle(multi, now, data);
      sigpipe_restore(&pipe_st);

      if(data->easy_conn &&
         !(data->easy_conn->handler->flags & PROTOPT_DIRLOCK))
        /* clear the bitmask only if not locked */
        data->easy_conn->cselect_bits = 0;

      if(CURLM_OK >= result)
        /* get the socket(s) and check if the state has been changed since
           last */
        singlesocket(multi, data);

      /* Now we fall-through and do the timer-based stuff, since we don't want
         to force the user to have to deal with timeouts as long as at least
         one connection in fact has traffic. */

      data = NULL; /* set data to NULL again to avoid calling
                      multi_runsingle() in case there's no need to */
      now = Curl_now(); /* get a newer time since the multi_runsingle() loop
                           may have taken some time */
    }
  }
  else {
    /* Asked to run due to time-out. Clear the 'lastcall' variable to force
       update_timer() to trigger a callback to the app again even if the same
       timeout is still the one to run after this call. That handles the case
       when the application asks libcurl to run the timeout prematurely. */
    memset(&multi->timer_lastcall, 0, sizeof(multi->timer_lastcall));
  }

  /*
   * The loop following here will go on as long as there are expire-times left
   * to process in the splay and 'data' will be re-assigned for every expired
   * handle we deal with.
   */
  do {
    /* the first loop lap 'data' can be NULL */
    if(data) {
      SIGPIPE_VARIABLE(pipe_st);

      sigpipe_ignore(data, &pipe_st);
      result = multi_runsingle(multi, now, data);
      sigpipe_restore(&pipe_st);

      if(CURLM_OK >= result)
        /* get the socket(s) and check if the state has been changed since
           last */
        singlesocket(multi, data);
    }

    /* Check if there's one (more) expired timer to deal with! This function
       extracts a matching node if there is one */

    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t) {
      data = t->payload; /* assign this for next loop */
      (void)add_next_timeout(now, multi, t->payload);
    }

  } while(t);

  *running_handles = multi->num_alive;
  return result;
}